

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char> *this)

{
  pointer *__arr;
  char delim;
  bool bVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *__first1;
  basic_string_view<char,_std::char_traits<char>_> *__last1;
  char *in_R9;
  string local_2a0;
  AssertionHelper local_280;
  Fixed local_250;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult iutest_ar;
  undefined1 local_70 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  re1_2;
  basic_string_view<char,_std::char_traits<char>_> re1_1 [3];
  undefined1 local_20 [8];
  basic_string_view<char,_std::char_traits<char>_> s1;
  iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char> *this_local;
  
  s1._M_str = (char *)this;
  pcVar2 = constant::arikitari_na_world<char>();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_20,pcVar2);
  re1_2.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x9;
  delim = constant::space<char>();
  iutest_ar._39_1_ = split<char,_nullptr>(delim);
  detail::operator|<std::basic_string_view<char,_std::char_traits<char>_>,_char,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_70,(basic_string_view<char,_std::char_traits<char>_> *)local_20,
             (split_helper<char,_true,_false,_false> *)&iutest_ar.field_0x27);
  iutest::detail::AlwaysZero();
  __arr = &re1_2.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __first1 = std::begin<std::basic_string_view<char,std::char_traits<char>>const,3ul>
                       ((basic_string_view<char,_std::char_traits<char>_> (*) [3])__arr);
  __last1 = std::end<std::basic_string_view<char,std::char_traits<char>>const,3ul>
                      ((basic_string_view<char,_std::char_traits<char>_> (*) [3])__arr);
  local_b0._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_70);
  local_b8 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_70);
  local_a1 = std::
             equal<std::basic_string_view<char,std::char_traits<char>>const*,__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                       (__first1,__last1,local_b0,
                        (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         )local_b8);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_a0,&local_a1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    memset(&local_250,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_250);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(internal *)local_a0,
               (AssertionResult *)
               "std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_280,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x112,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_280,&local_250);
    iutest::AssertionHelper::~AssertionHelper(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_250);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_70);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, SplitBySingeChar)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s1 = constant::arikitari_na_world<char_type>();
	const std::basic_string_view<char_type> re1_1[] = { constant::arikitari<char_type>(), constant::na<char_type>(), constant::world<char_type>() };
	const auto re1_2 = s1 | split(constant::space<char_type>());
	IUTEST_ASSERT_TRUE(std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end()));
	if constexpr(!std::is_same_v<char_type, char>) {
		const std::basic_string_view<char_type> s2 = constant::arikitarina_sekai<char_type>();
		const std::basic_string_view<char_type> re2_1[] = { constant::arikitarina<char_type>(), constant::sekai<char_type>() };
		const auto re2_2 = s2 | split(constant::space<char_type>());
		IUTEST_ASSERT_TRUE(std::equal(std::begin(re2_1), std::end(re2_1), re2_2.begin(), re2_2.end()));
	}
}